

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O0

void __thiscall OmegaSN::backtracking(OmegaSN *this,uint n)

{
  uint *puVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  iterator __first_00;
  iterator __last_00;
  value_type_conflict local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint nb;
  uint temp_chpt;
  uint v;
  uint temp_indState;
  double temp_Q;
  uint p;
  uint n_local;
  OmegaSN *this_local;
  
  temp_Q._0_4_ = this->nbStates;
  _v = (*this->Q[this->nbSegments - 1])[n];
  temp_chpt = 0;
  for (nb = 1; nb < temp_Q._0_4_; nb = nb + 1) {
    if (this->Q[this->nbSegments - 1][nb][n] < _v) {
      _v = this->Q[this->nbSegments - 1][nb][n];
      temp_chpt = nb;
    }
  }
  this->globalCost = this->Q[this->nbSegments - 1][temp_chpt][n];
  local_30 = this->nbSegments;
  local_2c = n;
  temp_Q._4_4_ = n;
  _p = this;
  while (local_30 = local_30 - 1, 1 < local_2c) {
    local_34 = local_2c;
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->changepoints,(value_type_conflict *)&local_34);
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->parameters,this->states + temp_chpt);
    local_2c = this->lastChpt[local_30][temp_chpt][local_2c];
    puVar1 = this->lastIndState[local_30][temp_chpt];
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->changepoints);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->changepoints,sVar2 - 1);
    temp_chpt = puVar1[*pvVar3];
  }
  local_38 = 1;
  std::vector<int,_std::allocator<int>_>::push_back(&this->changepoints,&local_38);
  std::vector<double,_std::allocator<double>_>::push_back
            (&this->parameters,this->states + temp_chpt);
  __first = std::vector<int,_std::allocator<int>_>::begin(&this->changepoints);
  __last = std::vector<int,_std::allocator<int>_>::end(&this->changepoints);
  std::reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current);
  __first_00 = std::vector<double,_std::allocator<double>_>::begin(&this->parameters);
  __last_00 = std::vector<double,_std::allocator<double>_>::end(&this->parameters);
  std::reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first_00._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last_00._M_current);
  return;
}

Assistant:

void OmegaSN::backtracking(unsigned int n)
{
  unsigned int p = nbStates;
  double temp_Q = Q[nbSegments - 1][0][n];
  unsigned int temp_indState = 0;

  for(unsigned int v = 1; v < p; v++)
  {
    if(Q[nbSegments - 1][v][n] < temp_Q)
    {
      temp_Q = Q[nbSegments - 1][v][n];
      temp_indState = v;
    }
  }

  globalCost = Q[nbSegments - 1][temp_indState][n]; ///fill the globalCost OmegaSN variable
  unsigned int temp_chpt = n;
  unsigned int nb = nbSegments - 1;

// /*
//std::cout << " u " << temp_indState << " t " << temp_chpt << std::endl;

  while(temp_chpt > 1)
  {
    changepoints.push_back(temp_chpt);
    parameters.push_back(states[temp_indState]);

    temp_chpt = lastChpt[nb][temp_indState][temp_chpt];
    temp_indState = lastIndState[nb][temp_indState][changepoints[changepoints.size()-1]];
    nb = nb - 1;
    //std::cout << " u " << temp_indState << " t " << temp_chpt << std::endl;
  }

  changepoints.push_back(1);
  parameters.push_back(states[temp_indState]);

  // */

  ///reverse the vector
  std::reverse(changepoints.begin(), changepoints.end());
  std::reverse(parameters.begin(), parameters.end());
}